

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O3

ze_result_t validation_layer::zesPerformanceFactorGetConfig(zes_perf_handle_t hPerf,double *pFactor)

{
  code *pcVar1;
  long lVar2;
  long *plVar3;
  ze_result_t result;
  ze_result_t zVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar7 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zesPerformanceFactorGetConfig(hPerf, pFactor)","");
  if (*(char *)(lVar7 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar7 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar1 = *(code **)(context + 0xa90);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar7 = *(long *)(context + 0xd30);
    lVar2 = *(long *)(context + 0xd38);
    lVar5 = lVar2 - lVar7 >> 3;
    if (lVar2 != lVar7) {
      lVar6 = 0;
      do {
        plVar3 = *(long **)(*(long *)(*(long *)(context + 0xd30) + lVar6 * 8) + 8);
        result = (**(code **)(*plVar3 + 0x5d0))(plVar3,hPerf,pFactor);
        if (result != ZE_RESULT_SUCCESS) goto LAB_0017f950;
        lVar6 = lVar6 + 1;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
    }
    lVar6 = context;
    if (((*(char *)(context + 4) != '\x01') ||
        (result = ZESHandleLifetimeValidation::zesPerformanceFactorGetConfigPrologue
                            ((ZESHandleLifetimeValidation *)(*(long *)(context + 0xd48) + 8),hPerf,
                             pFactor), result == ZE_RESULT_SUCCESS)) &&
       (zVar4 = (*pcVar1)(hPerf,pFactor), result = zVar4, lVar2 != lVar7)) {
      lVar7 = 0;
      do {
        plVar3 = *(long **)(*(long *)(*(long *)(lVar6 + 0xd30) + lVar7 * 8) + 8);
        result = (**(code **)(*plVar3 + 0x5d8))(plVar3,hPerf,pFactor,zVar4);
        if (result != ZE_RESULT_SUCCESS) break;
        lVar7 = lVar7 + 1;
        result = zVar4;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar7);
    }
  }
LAB_0017f950:
  logAndPropagateResult("zesPerformanceFactorGetConfig",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesPerformanceFactorGetConfig(
        zes_perf_handle_t hPerf,                        ///< [in] Handle for the Performance Factor domain.
        double* pFactor                                 ///< [in,out] Will contain the actual Performance Factor being used by the
                                                        ///< hardware (may not be the same as the requested Performance Factor).
        )
    {
        context.logger->log_trace("zesPerformanceFactorGetConfig(hPerf, pFactor)");

        auto pfnGetConfig = context.zesDdiTable.PerformanceFactor.pfnGetConfig;

        if( nullptr == pfnGetConfig )
            return logAndPropagateResult("zesPerformanceFactorGetConfig", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesPerformanceFactorGetConfigPrologue( hPerf, pFactor );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesPerformanceFactorGetConfig", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zesHandleLifetime.zesPerformanceFactorGetConfigPrologue( hPerf, pFactor );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesPerformanceFactorGetConfig", result);
        }

        auto driver_result = pfnGetConfig( hPerf, pFactor );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesPerformanceFactorGetConfigEpilogue( hPerf, pFactor ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesPerformanceFactorGetConfig", result);
        }

        return logAndPropagateResult("zesPerformanceFactorGetConfig", driver_result);
    }